

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O0

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::operator*
          (Matrix<long_double> *this,Matrix<long_double> *other)

{
  longdouble lVar1;
  longdouble lVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference this_00;
  reference pvVar5;
  ulong local_50;
  size_t k;
  size_t j;
  size_t i;
  Matrix<long_double> *C;
  Matrix<long_double> *other_local;
  Matrix<long_double> *this_local;
  
  if (this->M == other->N) {
    this_local = (Matrix<long_double> *)operator_new(0x30);
    Matrix(this_local,this->N,other->M);
    if (this_local == (Matrix<long_double> *)0x0) {
      std::operator<<((ostream *)&std::cerr,
                      "Matrix Multiplication: Unable to allocate new matrix product\n");
      this_local = (Matrix<long_double> *)0x0;
    }
    else {
      for (j = 0; j < this->N; j = j + 1) {
        for (k = 0; k < other->M; k = k + 1) {
          for (local_50 = 0; local_50 < this->M; local_50 = local_50 + 1) {
            pvVar3 = std::
                     vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ::operator[](&this->matrix,j);
            pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                               (pvVar3,local_50);
            lVar1 = *(longdouble *)pvVar4;
            pvVar3 = std::
                     vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ::operator[](&other->matrix,local_50);
            pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar3,k);
            lVar2 = *(longdouble *)pvVar4;
            this_00 = std::
                      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                      ::operator[](&this_local->matrix,j);
            pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](this_00,k);
            *(longdouble *)pvVar5 = *(longdouble *)pvVar5 + lVar1 * lVar2;
          }
        }
      }
    }
  }
  else {
    this_local = (Matrix<long_double> *)0x0;
  }
  return this_local;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::operator*(
        const neural_networks::utilities::Matrix<T> *other) const {
    if(M == other -> N) {
        neural_networks::utilities::Matrix<T> *C  = new Matrix(N, other -> M);
        if(!C) {
            std::cerr << "Matrix Multiplication: Unable to allocate new matrix product\n";
            return nullptr;
        }
        size_t i, j;
        register size_t k;
        for(i = 0; i < N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                for(k = 0; k < M; ++k) {
                    C -> matrix[i][j] += matrix[i][k] * other -> matrix[k][j]; }
            }
        }
        return C;

    } else {
        return nullptr;
    }
}